

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gelu_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::GELU_x86_avx512::forward_inplace(GELU_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [32];
  int iVar30;
  undefined1 auVar35 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 (*pauVar31) [64];
  int iVar32;
  ulong uVar33;
  ulong uVar34;
  undefined1 auVar36 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 extraout_var [60];
  undefined1 auVar48 [64];
  
  if ((this->super_GELU).fast_gelu == 0) {
    iVar30 = GELU::forward_inplace(&this->super_GELU,bottom_top_blob,opt);
    return iVar30;
  }
  iVar30 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar34 = 0;
  uVar33 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar33 = uVar34;
  }
  for (; uVar34 != uVar33; uVar34 = uVar34 + 1) {
    pauVar31 = (undefined1 (*) [64])
               (bottom_top_blob->cstep * uVar34 * bottom_top_blob->elemsize +
               (long)bottom_top_blob->data);
    for (iVar32 = 0; iVar32 + 0xf < iVar30; iVar32 = iVar32 + 0x10) {
      auVar42 = *pauVar31;
      auVar40 = vmulps_avx512f(auVar42,auVar42);
      auVar41._8_4_ = 0x3d372713;
      auVar41._0_8_ = 0x3d3727133d372713;
      auVar41._12_4_ = 0x3d372713;
      auVar41._16_4_ = 0x3d372713;
      auVar41._20_4_ = 0x3d372713;
      auVar41._24_4_ = 0x3d372713;
      auVar41._28_4_ = 0x3d372713;
      auVar41._32_4_ = 0x3d372713;
      auVar41._36_4_ = 0x3d372713;
      auVar41._40_4_ = 0x3d372713;
      auVar41._44_4_ = 0x3d372713;
      auVar41._48_4_ = 0x3d372713;
      auVar41._52_4_ = 0x3d372713;
      auVar41._56_4_ = 0x3d372713;
      auVar41._60_4_ = 0x3d372713;
      auVar41 = vmulps_avx512f(auVar40,auVar41);
      auVar41 = vfmadd213ps_avx512f(auVar41,auVar42,auVar42);
      auVar40._8_4_ = 0x3f4c4229;
      auVar40._0_8_ = 0x3f4c42293f4c4229;
      auVar40._12_4_ = 0x3f4c4229;
      auVar40._16_4_ = 0x3f4c4229;
      auVar40._20_4_ = 0x3f4c4229;
      auVar40._24_4_ = 0x3f4c4229;
      auVar40._28_4_ = 0x3f4c4229;
      auVar40._32_4_ = 0x3f4c4229;
      auVar40._36_4_ = 0x3f4c4229;
      auVar40._40_4_ = 0x3f4c4229;
      auVar40._44_4_ = 0x3f4c4229;
      auVar40._48_4_ = 0x3f4c4229;
      auVar40._52_4_ = 0x3f4c4229;
      auVar40._56_4_ = 0x3f4c4229;
      auVar40._60_4_ = 0x3f4c4229;
      auVar41 = vmulps_avx512f(auVar41,auVar40);
      auVar41 = vmaxps_avx512f(auVar41,(undefined1  [64])_ps512_tanh_lo);
      auVar41 = vminps_avx512f(auVar41,(undefined1  [64])_ps512_tanh_hi);
      in_ZMM2 = vmulps_avx512f(auVar41,auVar41);
      auVar40 = vfmadd213ps_avx512f((undefined1  [64])_ps512_cephes_tanh_p0,in_ZMM2,
                                    (undefined1  [64])_ps512_cephes_tanh_p1);
      auVar40 = vfmadd213ps_avx512f(auVar40,in_ZMM2,(undefined1  [64])_ps512_cephes_tanh_p2);
      auVar40 = vfmadd213ps_avx512f(auVar40,in_ZMM2,(undefined1  [64])_ps512_cephes_tanh_p3);
      auVar40 = vfmadd213ps_avx512f(auVar40,in_ZMM2,(undefined1  [64])_ps512_cephes_tanh_p4);
      auVar40 = vfmadd213ps_avx512f(auVar40,in_ZMM2,(undefined1  [64])_ps512_cephes_tanh_p5);
      auVar40 = vfmadd213ps_avx512f(auVar40,in_ZMM2,(undefined1  [64])_ps512_cephes_tanh_p6);
      auVar41 = vmulps_avx512f(auVar40,auVar41);
      auVar40 = vfmadd213ps_avx512f((undefined1  [64])_ps512_cephes_tanh_p7,in_ZMM2,
                                    (undefined1  [64])_ps512_cephes_tanh_p8);
      auVar40 = vfmadd213ps_avx512f(auVar40,in_ZMM2,(undefined1  [64])_ps512_cephes_tanh_p9);
      auVar40 = vfmadd213ps_avx512f(auVar40,in_ZMM2,(undefined1  [64])_ps512_cephes_tanh_p6);
      in_ZMM1 = vdivps_avx512f(auVar41,auVar40);
      auVar28._8_4_ = 0x3f000000;
      auVar28._0_8_ = 0x3f0000003f000000;
      auVar28._12_4_ = 0x3f000000;
      auVar28._16_4_ = 0x3f000000;
      auVar28._20_4_ = 0x3f000000;
      auVar28._24_4_ = 0x3f000000;
      auVar28._28_4_ = 0x3f000000;
      auVar28._32_4_ = 0x3f000000;
      auVar28._36_4_ = 0x3f000000;
      auVar28._40_4_ = 0x3f000000;
      auVar28._44_4_ = 0x3f000000;
      auVar28._48_4_ = 0x3f000000;
      auVar28._52_4_ = 0x3f000000;
      auVar28._56_4_ = 0x3f000000;
      auVar28._60_4_ = 0x3f000000;
      auVar42 = vmulps_avx512f(auVar42,auVar28);
      auVar42 = vfmadd213ps_avx512f(auVar42,in_ZMM1,auVar42);
      *pauVar31 = auVar42;
      pauVar31 = pauVar31 + 1;
    }
    for (; iVar32 + 7 < iVar30; iVar32 = iVar32 + 8) {
      auVar39 = *(undefined1 (*) [32])*pauVar31;
      auVar42._0_4_ = auVar39._0_4_ * auVar39._0_4_;
      auVar42._4_4_ = auVar39._4_4_ * auVar39._4_4_;
      auVar42._8_4_ = auVar39._8_4_ * auVar39._8_4_;
      auVar42._12_4_ = auVar39._12_4_ * auVar39._12_4_;
      auVar42._16_4_ = auVar39._16_4_ * auVar39._16_4_;
      auVar42._20_4_ = auVar39._20_4_ * auVar39._20_4_;
      auVar42._28_36_ = in_ZMM1._28_36_;
      auVar42._24_4_ = auVar39._24_4_ * auVar39._24_4_;
      auVar37._8_4_ = 0x3d372713;
      auVar37._0_8_ = 0x3d3727133d372713;
      auVar37._12_4_ = 0x3d372713;
      auVar37._16_4_ = 0x3d372713;
      auVar37._20_4_ = 0x3d372713;
      auVar37._24_4_ = 0x3d372713;
      auVar37._28_4_ = 0x3d372713;
      auVar37 = vmulps_avx512vl(auVar42._0_32_,auVar37);
      auVar36 = vfmadd213ps_fma(auVar37,auVar39,auVar39);
      auVar38._8_4_ = 0x3f4c4229;
      auVar38._0_8_ = 0x3f4c42293f4c4229;
      auVar38._12_4_ = 0x3f4c4229;
      auVar38._16_4_ = 0x3f4c4229;
      auVar38._20_4_ = 0x3f4c4229;
      auVar38._24_4_ = 0x3f4c4229;
      auVar38._28_4_ = 0x3f4c4229;
      auVar37 = vmulps_avx512vl(ZEXT1632(auVar36),auVar38);
      auVar47._8_4_ = 0xc1100000;
      auVar47._0_8_ = 0xc1100000c1100000;
      auVar47._12_4_ = 0xc1100000;
      auVar47._16_4_ = 0xc1100000;
      auVar47._20_4_ = 0xc1100000;
      auVar47._24_4_ = 0xc1100000;
      auVar47._28_4_ = 0xc1100000;
      auVar37 = vmaxps_avx512vl(auVar37,auVar47);
      auVar19._8_4_ = 0x41100000;
      auVar19._0_8_ = 0x4110000041100000;
      auVar19._12_4_ = 0x41100000;
      auVar19._16_4_ = 0x41100000;
      auVar19._20_4_ = 0x41100000;
      auVar19._24_4_ = 0x41100000;
      auVar19._28_4_ = 0x41100000;
      auVar37 = vminps_avx512vl(auVar37,auVar19);
      fVar1 = auVar37._0_4_;
      auVar48._0_4_ = fVar1 * fVar1;
      fVar7 = auVar37._4_4_;
      auVar48._4_4_ = fVar7 * fVar7;
      fVar2 = auVar37._8_4_;
      auVar48._8_4_ = fVar2 * fVar2;
      fVar3 = auVar37._12_4_;
      auVar48._12_4_ = fVar3 * fVar3;
      fVar4 = auVar37._16_4_;
      auVar48._16_4_ = fVar4 * fVar4;
      fVar5 = auVar37._20_4_;
      auVar48._20_4_ = fVar5 * fVar5;
      fVar6 = auVar37._24_4_;
      auVar48._28_36_ = in_ZMM2._28_36_;
      auVar48._24_4_ = fVar6 * fVar6;
      auVar47 = auVar48._0_32_;
      in_ZMM2 = ZEXT3264(auVar47);
      auVar51._8_4_ = 0xa59f25c0;
      auVar51._0_8_ = 0xa59f25c0a59f25c0;
      auVar51._12_4_ = 0xa59f25c0;
      auVar51._16_4_ = 0xa59f25c0;
      auVar51._20_4_ = 0xa59f25c0;
      auVar51._24_4_ = 0xa59f25c0;
      auVar51._28_4_ = 0xa59f25c0;
      auVar20._8_4_ = 0x2a61337e;
      auVar20._0_8_ = 0x2a61337e2a61337e;
      auVar20._12_4_ = 0x2a61337e;
      auVar20._16_4_ = 0x2a61337e;
      auVar20._20_4_ = 0x2a61337e;
      auVar20._24_4_ = 0x2a61337e;
      auVar20._28_4_ = 0x2a61337e;
      auVar38 = vfmadd213ps_avx512vl(auVar51,auVar47,auVar20);
      auVar21._8_4_ = 0xaebd37ff;
      auVar21._0_8_ = 0xaebd37ffaebd37ff;
      auVar21._12_4_ = 0xaebd37ff;
      auVar21._16_4_ = 0xaebd37ff;
      auVar21._20_4_ = 0xaebd37ff;
      auVar21._24_4_ = 0xaebd37ff;
      auVar21._28_4_ = 0xaebd37ff;
      auVar38 = vfmadd213ps_avx512vl(auVar38,auVar47,auVar21);
      auVar22._8_4_ = 0x335c0041;
      auVar22._0_8_ = 0x335c0041335c0041;
      auVar22._12_4_ = 0x335c0041;
      auVar22._16_4_ = 0x335c0041;
      auVar22._20_4_ = 0x335c0041;
      auVar22._24_4_ = 0x335c0041;
      auVar22._28_4_ = 0x335c0041;
      auVar38 = vfmadd213ps_avx512vl(auVar38,auVar47,auVar22);
      auVar23._8_4_ = 0x3779434a;
      auVar23._0_8_ = 0x3779434a3779434a;
      auVar23._12_4_ = 0x3779434a;
      auVar23._16_4_ = 0x3779434a;
      auVar23._20_4_ = 0x3779434a;
      auVar23._24_4_ = 0x3779434a;
      auVar23._28_4_ = 0x3779434a;
      auVar38 = vfmadd213ps_avx512vl(auVar38,auVar47,auVar23);
      auVar24._8_4_ = 0x3a270ded;
      auVar24._0_8_ = 0x3a270ded3a270ded;
      auVar24._12_4_ = 0x3a270ded;
      auVar24._16_4_ = 0x3a270ded;
      auVar24._20_4_ = 0x3a270ded;
      auVar24._24_4_ = 0x3a270ded;
      auVar24._28_4_ = 0x3a270ded;
      auVar38 = vfmadd213ps_avx512vl(auVar38,auVar47,auVar24);
      auVar54._8_4_ = 0x3ba059dc;
      auVar54._0_8_ = 0x3ba059dc3ba059dc;
      auVar54._12_4_ = 0x3ba059dc;
      auVar54._16_4_ = 0x3ba059dc;
      auVar54._20_4_ = 0x3ba059dc;
      auVar54._24_4_ = 0x3ba059dc;
      auVar54._28_4_ = 0x3ba059dc;
      auVar36 = vfmadd213ps_fma(auVar38,auVar47,auVar54);
      auVar29._4_4_ = auVar36._4_4_ * fVar7;
      auVar29._0_4_ = auVar36._0_4_ * fVar1;
      auVar29._8_4_ = auVar36._8_4_ * fVar2;
      auVar29._12_4_ = auVar36._12_4_ * fVar3;
      auVar29._16_4_ = fVar4 * 0.0;
      auVar29._20_4_ = fVar5 * 0.0;
      auVar29._24_4_ = fVar6 * 0.0;
      auVar29._28_4_ = auVar37._28_4_;
      auVar52._8_4_ = 0x35a0d3d8;
      auVar52._0_8_ = 0x35a0d3d835a0d3d8;
      auVar52._12_4_ = 0x35a0d3d8;
      auVar52._16_4_ = 0x35a0d3d8;
      auVar52._20_4_ = 0x35a0d3d8;
      auVar52._24_4_ = 0x35a0d3d8;
      auVar52._28_4_ = 0x35a0d3d8;
      auVar25._8_4_ = 0x38f895d6;
      auVar25._0_8_ = 0x38f895d638f895d6;
      auVar25._12_4_ = 0x38f895d6;
      auVar25._16_4_ = 0x38f895d6;
      auVar25._20_4_ = 0x38f895d6;
      auVar25._24_4_ = 0x38f895d6;
      auVar25._28_4_ = 0x38f895d6;
      auVar37 = vfmadd213ps_avx512vl(auVar52,auVar47,auVar25);
      auVar26._8_4_ = 0x3b14aa05;
      auVar26._0_8_ = 0x3b14aa053b14aa05;
      auVar26._12_4_ = 0x3b14aa05;
      auVar26._16_4_ = 0x3b14aa05;
      auVar26._20_4_ = 0x3b14aa05;
      auVar26._24_4_ = 0x3b14aa05;
      auVar26._28_4_ = 0x3b14aa05;
      auVar37 = vfmadd213ps_avx512vl(auVar37,auVar47,auVar26);
      auVar36 = vfmadd213ps_fma(auVar37,auVar47,auVar54);
      auVar37 = vdivps_avx(auVar29,ZEXT1632(auVar36));
      in_ZMM1 = ZEXT3264(auVar37);
      auVar27._8_4_ = 0x3f000000;
      auVar27._0_8_ = 0x3f0000003f000000;
      auVar27._12_4_ = 0x3f000000;
      auVar27._16_4_ = 0x3f000000;
      auVar27._20_4_ = 0x3f000000;
      auVar27._24_4_ = 0x3f000000;
      auVar27._28_4_ = 0x3f000000;
      auVar39 = vmulps_avx512vl(auVar39,auVar27);
      auVar36 = vfmadd213ps_fma(auVar39,auVar37,auVar39);
      *(undefined1 (*) [32])*pauVar31 = ZEXT1632(auVar36);
      pauVar31 = (undefined1 (*) [64])(*pauVar31 + 0x20);
    }
    for (; iVar32 + 3 < iVar30; iVar32 = iVar32 + 4) {
      auVar36 = *(undefined1 (*) [16])*pauVar31;
      auVar44._0_4_ = auVar36._0_4_ * auVar36._0_4_;
      auVar44._4_4_ = auVar36._4_4_ * auVar36._4_4_;
      auVar44._8_4_ = auVar36._8_4_ * auVar36._8_4_;
      auVar44._12_4_ = auVar36._12_4_ * auVar36._12_4_;
      auVar35._8_4_ = 0x3d372713;
      auVar35._0_8_ = 0x3d3727133d372713;
      auVar35._12_4_ = 0x3d372713;
      auVar35 = vmulps_avx512vl(auVar44,auVar35);
      auVar35 = vfmadd213ps_fma(auVar35,auVar36,auVar36);
      auVar8._8_4_ = 0x3f4c4229;
      auVar8._0_8_ = 0x3f4c42293f4c4229;
      auVar8._12_4_ = 0x3f4c4229;
      auVar35 = vmulps_avx512vl(auVar35,auVar8);
      auVar9._8_4_ = 0xc1100000;
      auVar9._0_8_ = 0xc1100000c1100000;
      auVar9._12_4_ = 0xc1100000;
      auVar35 = vmaxps_avx512vl(auVar35,auVar9);
      auVar10._8_4_ = 0x41100000;
      auVar10._0_8_ = 0x4110000041100000;
      auVar10._12_4_ = 0x41100000;
      auVar35 = vminps_avx512vl(auVar35,auVar10);
      fVar1 = auVar35._0_4_;
      auVar46._0_4_ = fVar1 * fVar1;
      fVar7 = auVar35._4_4_;
      auVar46._4_4_ = fVar7 * fVar7;
      fVar2 = auVar35._8_4_;
      auVar46._8_4_ = fVar2 * fVar2;
      fVar3 = auVar35._12_4_;
      auVar46._12_4_ = fVar3 * fVar3;
      in_ZMM2 = ZEXT1664(auVar46);
      auVar49._8_4_ = 0xa59f25c0;
      auVar49._0_8_ = 0xa59f25c0a59f25c0;
      auVar49._12_4_ = 0xa59f25c0;
      auVar11._8_4_ = 0x2a61337e;
      auVar11._0_8_ = 0x2a61337e2a61337e;
      auVar11._12_4_ = 0x2a61337e;
      auVar35 = vfmadd213ps_avx512vl(auVar49,auVar46,auVar11);
      auVar12._8_4_ = 0xaebd37ff;
      auVar12._0_8_ = 0xaebd37ffaebd37ff;
      auVar12._12_4_ = 0xaebd37ff;
      auVar35 = vfmadd213ps_avx512vl(auVar35,auVar46,auVar12);
      auVar13._8_4_ = 0x335c0041;
      auVar13._0_8_ = 0x335c0041335c0041;
      auVar13._12_4_ = 0x335c0041;
      auVar35 = vfmadd213ps_avx512vl(auVar35,auVar46,auVar13);
      auVar14._8_4_ = 0x3779434a;
      auVar14._0_8_ = 0x3779434a3779434a;
      auVar14._12_4_ = 0x3779434a;
      auVar35 = vfmadd213ps_avx512vl(auVar35,auVar46,auVar14);
      auVar15._8_4_ = 0x3a270ded;
      auVar15._0_8_ = 0x3a270ded3a270ded;
      auVar15._12_4_ = 0x3a270ded;
      auVar35 = vfmadd213ps_avx512vl(auVar35,auVar46,auVar15);
      auVar53._8_4_ = 0x3ba059dc;
      auVar53._0_8_ = 0x3ba059dc3ba059dc;
      auVar53._12_4_ = 0x3ba059dc;
      auVar35 = vfmadd213ps_fma(auVar35,auVar46,auVar53);
      auVar45._0_4_ = auVar35._0_4_ * fVar1;
      auVar45._4_4_ = auVar35._4_4_ * fVar7;
      auVar45._8_4_ = auVar35._8_4_ * fVar2;
      auVar45._12_4_ = auVar35._12_4_ * fVar3;
      auVar50._8_4_ = 0x35a0d3d8;
      auVar50._0_8_ = 0x35a0d3d835a0d3d8;
      auVar50._12_4_ = 0x35a0d3d8;
      auVar16._8_4_ = 0x38f895d6;
      auVar16._0_8_ = 0x38f895d638f895d6;
      auVar16._12_4_ = 0x38f895d6;
      auVar35 = vfmadd213ps_avx512vl(auVar50,auVar46,auVar16);
      auVar17._8_4_ = 0x3b14aa05;
      auVar17._0_8_ = 0x3b14aa053b14aa05;
      auVar17._12_4_ = 0x3b14aa05;
      auVar35 = vfmadd213ps_avx512vl(auVar35,auVar46,auVar17);
      auVar35 = vfmadd213ps_fma(auVar35,auVar46,auVar53);
      auVar35 = vdivps_avx(auVar45,auVar35);
      in_ZMM1 = ZEXT1664(auVar35);
      auVar18._8_4_ = 0x3f000000;
      auVar18._0_8_ = 0x3f0000003f000000;
      auVar18._12_4_ = 0x3f000000;
      auVar36 = vmulps_avx512vl(auVar36,auVar18);
      auVar36 = vfmadd213ps_fma(auVar36,auVar35,auVar36);
      *(undefined1 (*) [16])*pauVar31 = auVar36;
      pauVar31 = (undefined1 (*) [64])(*pauVar31 + 0x10);
    }
    for (; iVar32 < iVar30; iVar32 = iVar32 + 1) {
      fVar1 = *(float *)*pauVar31;
      fVar7 = fVar1 * 0.5;
      auVar36 = vfmadd213ss_fma(ZEXT416((uint)(fVar1 * fVar1 * 0.044715)),ZEXT416((uint)fVar1),
                                ZEXT416((uint)fVar1));
      in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
      auVar43._0_4_ = tanhf(auVar36._0_4_ * 0.7978845);
      auVar43._4_60_ = extraout_var;
      in_ZMM1 = ZEXT464((uint)fVar7);
      auVar36 = vfmadd213ss_fma(auVar43._0_16_,ZEXT416((uint)fVar7),ZEXT416((uint)fVar7));
      *(int *)*pauVar31 = auVar36._0_4_;
      pauVar31 = (undefined1 (*) [64])(*pauVar31 + 4);
    }
  }
  return 0;
}

Assistant:

int GELU_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (!fast_gelu)
    {
        return GELU::forward_inplace(bottom_top_blob, opt);
    }

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _half512 = _mm512_set1_ps(0.5f);
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _fast1c512 = _mm512_set1_ps(0.79788452f);
        __m512 _fast2c512 = _mm512_set1_ps(0.044715f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _pLoad = _mm512_loadu_ps(ptr);

            __m512 _cube = _mm512_mul_ps(_pLoad, _pLoad);
            _cube = _mm512_mul_ps(_pLoad, _cube);

            __m512 _blob = _mm512_mul_ps(_fast2c512, _cube);
            _blob = _mm512_add_ps(_pLoad, _blob);
            _blob = _mm512_mul_ps(_fast1c512, _blob);
            _blob = tanh512_ps(_blob);
            _blob = _mm512_add_ps(_one512, _blob);

            _blob = _mm512_mul_ps(_half512, _mm512_mul_ps(_blob, _pLoad));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _half256 = _mm256_set1_ps(0.5f);
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _fast1c256 = _mm256_set1_ps(0.79788452f);
        __m256 _fast2c256 = _mm256_set1_ps(0.044715f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _pLoad = _mm256_loadu_ps(ptr);

            __m256 _cube = _mm256_mul_ps(_pLoad, _pLoad);
            _cube = _mm256_mul_ps(_pLoad, _cube);

            __m256 _blob = _mm256_mul_ps(_fast2c256, _cube);
            _blob = _mm256_add_ps(_pLoad, _blob);
            _blob = _mm256_mul_ps(_fast1c256, _blob);
            _blob = tanh256_ps(_blob);
            _blob = _mm256_add_ps(_one256, _blob);

            _blob = _mm256_mul_ps(_half256, _mm256_mul_ps(_blob, _pLoad));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _half128 = _mm_set1_ps(0.5f);
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _fast1c128 = _mm_set1_ps(0.79788452f);
        __m128 _fast2c128 = _mm_set1_ps(0.044715f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _pLoad = _mm_loadu_ps(ptr);

            __m128 _cube = _mm_mul_ps(_pLoad, _pLoad);
            _cube = _mm_mul_ps(_pLoad, _cube);

            __m128 _blob = _mm_mul_ps(_fast2c128, _cube);
            _blob = _mm_add_ps(_pLoad, _blob);
            _blob = _mm_mul_ps(_fast1c128, _blob);
            _blob = tanh_ps(_blob);
            _blob = _mm_add_ps(_one128, _blob);

            _blob = _mm_mul_ps(_half128, _mm_mul_ps(_blob, _pLoad));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            // y = 0.5x * (1 + tanh(sqrt(2/Pi) * (x + 0.044715x^3)))
            *ptr = 0.5f * *ptr * (1.0f + tanhf(0.79788452f * (*ptr + 0.044715f * *ptr * *ptr * *ptr)));

            ptr++;
        }
    }

    return 0;
}